

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O0

Vector * CGNIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
                double OmegaPrecond)

{
  Boolean BVar1;
  LASErrIdType LVar2;
  size_t Dim_00;
  Vector *pVVar3;
  QMatrix *pQVar4;
  double bNorm_00;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 local_160 [8];
  Vector z;
  Vector s;
  Vector q;
  Vector p;
  Vector r;
  size_t Dim;
  double bNorm;
  double RhoOld;
  double Rho;
  double Beta;
  double Alpha;
  int Iter;
  double OmegaPrecond_local;
  PrecondProcType PrecondProc_local;
  int MaxIter_local;
  Vector *b_local;
  Vector *x_local;
  QMatrix *A_local;
  
  bNorm = 0.0;
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim_00 = Q_GetDim(A);
  V_Constr((Vector *)&p.Cmp,"r",Dim_00,Normal,True);
  V_Constr((Vector *)&q.Cmp,"p",Dim_00,Normal,True);
  V_Constr((Vector *)&s.Cmp,"q",Dim_00,Normal,True);
  V_Constr((Vector *)local_160,"z",Dim_00,Normal,True);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar1 = Q_KerDefined(A), BVar1 != False)) {
    V_Constr((Vector *)&z.Cmp,"s",Dim_00,Normal,True);
  }
  LVar2 = LASResult();
  if (LVar2 == LASOK) {
    bNorm_00 = l2Norm_V(b);
    Alpha._4_4_ = 0;
    dVar5 = l1Norm_V(x);
    auVar7._8_4_ = (int)(Dim_00 >> 0x20);
    auVar7._0_8_ = Dim_00;
    auVar7._12_4_ = 0x45300000;
    if (ABS(dVar5 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)Dim_00) - 4503599627370496.0))) <
        2.2250738585072014e-307) {
      Asgn_VV((Vector *)&p.Cmp,b);
    }
    else {
      BVar1 = Q_KerDefined(A);
      if (BVar1 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar3 = Mul_QV(A,x);
      pVVar3 = Sub_VV(b,pVVar3);
      Asgn_VV((Vector *)&p.Cmp,pVVar3);
    }
    if ((PrecondProc == (PrecondProcType)0x0) && (BVar1 = Q_KerDefined(A), BVar1 == False)) {
      while( true ) {
        dVar5 = l2Norm_V((Vector *)&p.Cmp);
        BVar1 = RTCResult(Alpha._4_4_,dVar5,bNorm_00,CGNIterId);
        if (BVar1 != False || MaxIter <= Alpha._4_4_) break;
        Alpha._4_4_ = Alpha._4_4_ + 1;
        pQVar4 = Transp_Q(A);
        pVVar3 = Mul_QV(pQVar4,(Vector *)&p.Cmp);
        Asgn_VV((Vector *)local_160,pVVar3);
        dVar5 = l2Norm_V((Vector *)local_160);
        dVar5 = pow(dVar5,2.0);
        if (Alpha._4_4_ == 1) {
          Asgn_VV((Vector *)&q.Cmp,(Vector *)local_160);
        }
        else {
          pVVar3 = Mul_SV(dVar5 / bNorm,(Vector *)&q.Cmp);
          pVVar3 = Add_VV((Vector *)local_160,pVVar3);
          Asgn_VV((Vector *)&q.Cmp,pVVar3);
        }
        pVVar3 = Mul_QV(A,(Vector *)&q.Cmp);
        Asgn_VV((Vector *)&s.Cmp,pVVar3);
        dVar6 = l2Norm_V((Vector *)&s.Cmp);
        dVar6 = pow(dVar6,2.0);
        pVVar3 = Mul_SV(dVar5 / dVar6,(Vector *)&q.Cmp);
        AddAsgn_VV(x,pVVar3);
        pVVar3 = Mul_SV(dVar5 / dVar6,(Vector *)&s.Cmp);
        SubAsgn_VV((Vector *)&p.Cmp,pVVar3);
        bNorm = dVar5;
      }
    }
    else {
      while( true ) {
        dVar5 = l2Norm_V((Vector *)&p.Cmp);
        BVar1 = RTCResult(Alpha._4_4_,dVar5,bNorm_00,CGNIterId);
        if (BVar1 != False || MaxIter <= Alpha._4_4_) break;
        Alpha._4_4_ = Alpha._4_4_ + 1;
        if (PrecondProc == (PrecondProcType)0x0) {
          Asgn_VV((Vector *)local_160,(Vector *)&p.Cmp);
        }
        else {
          (*PrecondProc)(A,(Vector *)local_160,(Vector *)&p.Cmp,OmegaPrecond);
          pQVar4 = Transp_Q(A);
          (*PrecondProc)(pQVar4,(Vector *)&s.Cmp,(Vector *)local_160,OmegaPrecond);
          pQVar4 = Transp_Q(A);
          pVVar3 = Mul_QV(pQVar4,(Vector *)&s.Cmp);
          Asgn_VV((Vector *)local_160,pVVar3);
        }
        BVar1 = Q_KerDefined(A);
        if (BVar1 != False) {
          OrthoRightKer_VQ((Vector *)local_160,A);
        }
        dVar5 = l2Norm_V((Vector *)local_160);
        dVar5 = pow(dVar5,2.0);
        if (Alpha._4_4_ == 1) {
          Asgn_VV((Vector *)&q.Cmp,(Vector *)local_160);
        }
        else {
          pVVar3 = Mul_SV(dVar5 / bNorm,(Vector *)&q.Cmp);
          pVVar3 = Add_VV((Vector *)local_160,pVVar3);
          Asgn_VV((Vector *)&q.Cmp,pVVar3);
        }
        pVVar3 = Mul_QV(A,(Vector *)&q.Cmp);
        Asgn_VV((Vector *)&s.Cmp,pVVar3);
        if (PrecondProc == (PrecondProcType)0x0) {
          Asgn_VV((Vector *)&z.Cmp,(Vector *)&s.Cmp);
        }
        else {
          (*PrecondProc)(A,(Vector *)&z.Cmp,(Vector *)&s.Cmp,OmegaPrecond);
        }
        BVar1 = Q_KerDefined(A);
        if (BVar1 != False) {
          OrthoRightKer_VQ((Vector *)&z.Cmp,A);
        }
        dVar6 = l2Norm_V((Vector *)&z.Cmp);
        dVar6 = pow(dVar6,2.0);
        pVVar3 = Mul_SV(dVar5 / dVar6,(Vector *)&q.Cmp);
        AddAsgn_VV(x,pVVar3);
        pVVar3 = Mul_SV(dVar5 / dVar6,(Vector *)&s.Cmp);
        SubAsgn_VV((Vector *)&p.Cmp,pVVar3);
        bNorm = dVar5;
      }
    }
    BVar1 = Q_KerDefined(A);
    if (BVar1 != False) {
      OrthoRightKer_VQ(x,A);
    }
  }
  V_Destr((Vector *)&p.Cmp);
  V_Destr((Vector *)&q.Cmp);
  V_Destr((Vector *)&s.Cmp);
  V_Destr((Vector *)local_160);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar1 = Q_KerDefined(A), BVar1 != False)) {
    V_Destr((Vector *)&z.Cmp);
  }
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *CGNIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    int Iter;
    double Alpha, Beta, Rho, RhoOld = 0.0;
    double bNorm;
    size_t Dim;
    Vector r, p, q, s, z;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);
    V_Constr(&p, "p", Dim, Normal, True);
    V_Constr(&q, "q", Dim, Normal, True);
    V_Constr(&z, "z", Dim, Normal, True);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Constr(&s, "s", Dim, Normal, True);

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);
        
        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        if (PrecondProc != NULL || Q_KerDefined(A)) {
            /* preconditioned CGN */
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, CGNIterId)
                && Iter < MaxIter) {
                Iter++;
		if (PrecondProc != NULL) {
                    (*PrecondProc)(A, &z, &r, OmegaPrecond);
                    (*PrecondProc)(Transp_Q(A), &q, &z, OmegaPrecond);
                    Asgn_VV(&z, Mul_QV(Transp_Q(A), &q));
	        } else {
		    Asgn_VV(&z, &r);
		}
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&z, A);
                Rho = pow(l2Norm_V(&z), 2.0);
                if (Iter == 1) {
                    Asgn_VV(&p, &z);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&p, Add_VV(&z, Mul_SV(Beta, &p)));
                }
                Asgn_VV(&q, Mul_QV(A, &p));
		if (PrecondProc != NULL)
                    (*PrecondProc)(A, &s, &q, OmegaPrecond);
		else
		    Asgn_VV(&s, &q);
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&s, A);
                Alpha = Rho / pow(l2Norm_V(&s), 2.0);
                AddAsgn_VV(x, Mul_SV(Alpha, &p));
                SubAsgn_VV(&r, Mul_SV(Alpha, &q));
                RhoOld = Rho;
            }
        } else {
            /* plain CGN */
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, CGNIterId)
                && Iter < MaxIter) {
                Iter++;
                Asgn_VV(&z, Mul_QV(Transp_Q(A), &r));
                Rho = pow(l2Norm_V(&z), 2.0);
                if (Iter == 1) {
                    Asgn_VV(&p, &z);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&p, Add_VV(&z, Mul_SV(Beta, &p)));
                }
                Asgn_VV(&q, Mul_QV(A, &p));
                Alpha = Rho / pow(l2Norm_V(&q), 2.0);
                AddAsgn_VV(x, Mul_SV(Alpha, &p));
                SubAsgn_VV(&r, Mul_SV(Alpha, &q));
                RhoOld = Rho;
            }
        }
        if (Q_KerDefined(A))
	   OrthoRightKer_VQ(x, A);
    }
    
    V_Destr(&r);
    V_Destr(&p);
    V_Destr(&q);
    V_Destr(&z);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Destr(&s);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}